

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_raw.c
# Opt level: O0

void test_format(_func_int_archive_ptr *set_format)

{
  int iVar1;
  void *buff_00;
  la_ssize_t lVar2;
  char *pcVar3;
  char *err;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  char filedata [64];
  _func_int_archive_ptr *set_format_local;
  
  buff_00 = malloc(1000000);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L')',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = (*set_format)((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"(*set_format)(a)",(void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",
                      (void *)used);
  iVar1 = archive_write_open_memory((archive *)used,buff_00,1000000,&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'1',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)a,"test");
  archive_entry_set_filetype((archive_entry *)a,0x8000);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar2 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'6',9,"9",lVar2,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'=',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_raw((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                      (void *)used);
  iVar1 = archive_read_support_filter_none((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_none(a)",
                      (void *)used);
  iVar1 = archive_read_open_memory((archive *)used,buff_00,buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)used);
  lVar2 = archive_read_data((archive *)used,&ae,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'C',9,"9",lVar2,"archive_read_data(a, filedata, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'D',&ae,"filedata","12345678","\"12345678\"",9,"9",(void *)0x0);
  iVar1 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)used);
  iVar1 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'I',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = (*set_format)((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"(*set_format)(a)",(void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",
                      (void *)used);
  iVar1 = archive_write_open_memory((archive *)used,buff_00,1000000,&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'O',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)a,"test");
  archive_entry_set_filetype((archive_entry *)a,0x8000);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar2 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'T',9,"9",lVar2,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'W',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)a,"test2");
  archive_entry_set_filetype((archive_entry *)a,0x8000);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'Z',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)used);
  pcVar3 = archive_error_string((archive *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'\\',pcVar3,"err","Raw format only supports one entry per archive",
                      "\"Raw format only supports one entry per archive\"",0x2f,"47",(void *)0x0);
  archive_entry_free((archive_entry *)a);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'c',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = (*set_format)((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar1,"(*set_format)(a)",(void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",
                      (void *)used);
  iVar1 = archive_write_open_memory((archive *)used,buff_00,1000000,&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                   ,L'i',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"dir");
  archive_entry_set_filetype((archive_entry *)a,0x4000);
  archive_entry_set_size((archive_entry *)a,0x200);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'm',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)used);
  pcVar3 = archive_error_string((archive *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'o',pcVar3,"err","Raw format only supports filetype AE_IFREG",
                      "\"Raw format only supports filetype AE_IFREG\"",0x2b,"43",(void *)0x0);
  archive_entry_free((archive_entry *)a);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_raw.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  free(buff_00);
  return;
}

Assistant:

static void
test_format(int	(*set_format)(struct archive *))
{
	char filedata[64];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1000000;
	char *buff;
	const char *err;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, (*set_format)(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test");
	archive_entry_set_filetype(ae, AE_IFREG);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 9, archive_write_data(a, "12345678", 9));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Read from it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualIntA(a, 9, archive_read_data(a, filedata, 10));
	assertEqualMem(filedata, "12345678", 9);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Create a new archive */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, (*set_format)(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used));

	/* write first file: that should succeed */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test");
	archive_entry_set_filetype(ae, AE_IFREG);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 9, archive_write_data(a, "12345678", 9));

	/* write second file: this should fail */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test2");
	archive_entry_set_filetype(ae, AE_IFREG);
	assertEqualIntA(a, ARCHIVE_FATAL, archive_write_header(a, ae));
	err = archive_error_string(a);
	assertEqualMem(err, "Raw format only supports one entry per archive", 47);
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Create a new archive */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, (*set_format)(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used));

	/* write a directory: this should fail */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_filetype(ae, AE_IFDIR);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_FATAL, archive_write_header(a, ae));
	err = archive_error_string(a);
	assertEqualMem(err, "Raw format only supports filetype AE_IFREG", 43);
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	free(buff);
}